

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O1

void __thiscall MuxerManager::doMux(MuxerManager *this,string *outFileName,FileFactory *fileFactory)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pointer pWVar3;
  int iVar4;
  BufferedFileWriter *pBVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  WriterData *i;
  pointer data;
  AVPacket avPacket;
  AVPacket local_78;
  
  preinitMux(this,outFileName,fileFactory);
  pBVar5 = (BufferedFileWriter *)operator_new(0x130);
  BufferedFileWriter::BufferedFileWriter(pBVar5);
  this->m_fileWriter = pBVar5;
  local_78.flags = 0;
  local_78.data = (uint8_t *)0x0;
  local_78.size = 0;
  local_78.stream_index = 0;
  local_78.pts = 0;
  local_78.dts = 0;
  local_78.duration = 0;
  local_78.pos = 0;
  local_78.pcr = 0;
  local_78.codec = (BaseAbstractStreamReader *)0x0;
  local_78.codecID = 0;
  iVar4 = METADemuxer::readPacket(&this->m_metaDemuxer,&local_78);
  if (iVar4 != 1) {
    p_Var1 = &(this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header;
    do {
      if (this->m_cutStart < 1 || this->m_cutStart <= local_78.pts) {
        if (this->m_cutEnd <= local_78.pts && 0 < this->m_cutEnd) break;
        p_Var2 = (this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
            p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < local_78.stream_index]) {
          if (local_78.stream_index <= (int)*(size_t *)(p_Var2 + 1)) {
            p_Var6 = p_Var2;
          }
        }
        p_Var7 = p_Var1;
        if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
           (p_Var7 = (_Rb_tree_header *)p_Var6,
           local_78.stream_index < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
          p_Var7 = p_Var1;
        }
        (*(&this->m_mainMuxer)[p_Var7 != p_Var1]->_vptr_AbstractMuxer[7])
                  ((&this->m_mainMuxer)[p_Var7 != p_Var1],&local_78);
      }
      iVar4 = METADemuxer::readPacket(&this->m_metaDemuxer,&local_78);
    } while (iVar4 != 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Flushing write buffer",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  sLastMsg = true;
  if (this->m_subMuxer != (AbstractMuxer *)0x0) {
    (*this->m_subMuxer->_vptr_AbstractMuxer[3])();
  }
  (*this->m_mainMuxer->_vptr_AbstractMuxer[3])();
  pWVar3 = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (data = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>.
              _M_impl.super__Vector_impl_data._M_start; data != pWVar3; data = data + 1) {
    asyncWriteBlock(this,data);
  }
  if (this->m_fileWriter->m_nothingToExecute == false) {
    do {
      Process::sleep(1);
    } while (this->m_fileWriter->m_nothingToExecute != true);
  }
  (*this->m_mainMuxer->_vptr_AbstractMuxer[4])();
  if (this->m_subMuxer != (AbstractMuxer *)0x0) {
    (*this->m_subMuxer->_vptr_AbstractMuxer[4])();
  }
  pBVar5 = this->m_fileWriter;
  if (pBVar5 != (BufferedFileWriter *)0x0) {
    BufferedFileWriter::~BufferedFileWriter(pBVar5);
    operator_delete(pBVar5,0x130);
  }
  this->m_fileWriter = (BufferedFileWriter *)0x0;
  return;
}

Assistant:

void MuxerManager::doMux(const string& outFileName, FileFactory* fileFactory)
{
    preinitMux(outFileName, fileFactory);

    m_fileWriter = new BufferedFileWriter();
    AVPacket avPacket;

    while (true)
    {
        const int avRez = m_metaDemuxer.readPacket(avPacket);

        if (avRez == BufferedReader::DATA_EOF)
            break;
        if (m_cutStart > 0)
        {
            if (avPacket.pts < m_cutStart)
                continue;
        }
        if (m_cutEnd > 0 && avPacket.pts >= m_cutEnd)
            break;

        if (m_subStreamIndex.find(avPacket.stream_index) != m_subStreamIndex.end())
            m_subMuxer->muxPacket(avPacket);
        else
            m_mainMuxer->muxPacket(avPacket);
    }

    LTRACE(LT_INFO, 2, "Flushing write buffer");

    if (m_subMuxer)
        m_subMuxer->doFlush();
    m_mainMuxer->doFlush();

    for (auto& i : m_delayedData) asyncWriteBlock(i);

    waitForWriting();

    m_mainMuxer->close();
    if (m_subMuxer)
        m_subMuxer->close();

    delete m_fileWriter;

    m_fileWriter = nullptr;
}